

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

int Bac_ManExtract_rec(Gia_Man_t *pNew,Bac_Ntk_t *p,int i,int fBuffers,Vec_Int_t *vMap)

{
  Bac_Man_t *pBVar1;
  void **ppvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Bac_ObjType_t BVar7;
  int iVar8;
  Bac_Ntk_t *pBVar9;
  int iRes1;
  int iRes0;
  Bac_ObjType_t Type;
  Vec_Int_t Leaves;
  Dec_Graph_t *pGraph;
  int pLits [16];
  Bac_ObjType_t local_5c;
  int local_58;
  int nLits;
  int iFanin;
  int iObj_1;
  Bac_Ntk_t *pBox;
  int iBox;
  int iObj;
  Bac_Ntk_t *pHost;
  int iRes;
  Vec_Int_t *vMap_local;
  int fBuffers_local;
  int i_local;
  Bac_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  pNew_local._4_4_ = Bac_ObjCopy(p,i);
  if (pNew_local._4_4_ < 0) {
    iVar4 = Bac_ObjIsCo(p,i);
    if (iVar4 == 0) {
      iVar4 = Bac_ObjIsPi(p,i);
      if (iVar4 == 0) {
        iVar4 = Bac_ObjIsBo(p,i);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0xd4,
                        "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
        }
        iVar4 = Bac_BoxBoBox(p,i);
        iVar5 = Bac_ObjIsBoxUser(p,iVar4);
        if (iVar5 == 0) {
          iVar5 = Bac_ObjIsBoxPrim(p,iVar4);
          if (iVar5 == 0) {
            __assert_fail("Bac_ObjIsBoxPrim(p, iBox)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                          ,0x8a,
                          "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
            ;
          }
          local_5c = BAC_OBJ_NONE;
          while( true ) {
            bVar3 = false;
            if (-1 < (int)((iVar4 + -1) - local_5c)) {
              iVar5 = Bac_ObjIsBi(p,(iVar4 + -1) - local_5c);
              bVar3 = false;
              if (iVar5 != 0) {
                local_58 = Bac_BoxFanin(p,iVar4,local_5c);
                bVar3 = true;
              }
            }
            if (!bVar3) break;
            iVar5 = Bac_ManExtract_rec(pNew,p,local_58,fBuffers,vMap);
            pLits[(long)(int)local_5c + -2] = iVar5;
            local_5c = local_5c + BAC_OBJ_PI;
          }
          if (0x10 < (int)local_5c) {
            __assert_fail("nLits <= 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                          ,0x8d,
                          "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
            ;
          }
          if (p->pDesign->ppGraphs != (void **)0x0) {
            ppvVar2 = p->pDesign->ppGraphs;
            iVar4 = Bac_BoxNtkId(p,iVar4);
            Leaves.pArray = (int *)ppvVar2[iVar4];
            iRes0 = local_5c;
            Type = local_5c;
            Leaves._0_8_ = &pGraph;
            if ((Dec_Graph_t *)Leaves.pArray != (Dec_Graph_t *)0x0) {
              iVar4 = Gia_ManFactorGraph(pNew,(Dec_Graph_t *)Leaves.pArray,(Vec_Int_t *)&iRes0);
              return iVar4;
            }
            __assert_fail("pGraph != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                          ,0x93,
                          "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
            ;
          }
          BVar7 = Bac_ObjType(p,iVar4);
          if (local_5c == BAC_OBJ_NONE) {
            if (BVar7 == BAC_BOX_CF) {
              pHost._4_4_ = 0;
            }
            else {
              if (BVar7 != BAC_BOX_CT) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                              ,0x9f,
                              "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                             );
              }
              pHost._4_4_ = 1;
            }
          }
          else if (local_5c == BAC_OBJ_PI) {
            if (BVar7 == BAC_BOX_BUF) {
              pHost._4_4_ = (int)pGraph;
            }
            else {
              if (BVar7 != BAC_BOX_INV) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                              ,0xa7,
                              "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                             );
              }
              pHost._4_4_ = Abc_LitNot((int)pGraph);
            }
          }
          else if (local_5c == BAC_OBJ_PO) {
            if (BVar7 == BAC_BOX_AND) {
              pHost._4_4_ = Gia_ManHashAnd(pNew,(int)pGraph,pGraph._4_4_);
            }
            else if (BVar7 == BAC_BOX_NAND) {
              iVar4 = Gia_ManHashAnd(pNew,(int)pGraph,pGraph._4_4_);
              pHost._4_4_ = Abc_LitNot(iVar4);
            }
            else if (BVar7 == BAC_BOX_OR) {
              pHost._4_4_ = Gia_ManHashOr(pNew,(int)pGraph,pGraph._4_4_);
            }
            else if (BVar7 == BAC_BOX_NOR) {
              iVar4 = Gia_ManHashOr(pNew,(int)pGraph,pGraph._4_4_);
              pHost._4_4_ = Abc_LitNot(iVar4);
            }
            else if (BVar7 == BAC_BOX_XOR) {
              pHost._4_4_ = Gia_ManHashXor(pNew,(int)pGraph,pGraph._4_4_);
            }
            else if (BVar7 == BAC_BOX_XNOR) {
              iVar4 = Gia_ManHashXor(pNew,(int)pGraph,pGraph._4_4_);
              pHost._4_4_ = Abc_LitNot(iVar4);
            }
            else if (BVar7 == BAC_BOX_SHARP) {
              iVar4 = Abc_LitNot(pGraph._4_4_);
              pHost._4_4_ = Gia_ManHashAnd(pNew,(int)pGraph,iVar4);
            }
            else {
              if (BVar7 != BAC_BOX_SHARPL) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                              ,0xbb,
                              "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                             );
              }
              iVar4 = Abc_LitNot((int)pGraph);
              pHost._4_4_ = Gia_ManHashAnd(pNew,iVar4,pGraph._4_4_);
            }
          }
          else {
            if (local_5c != BAC_OBJ_BI) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                            ,0xd0,
                            "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                           );
            }
            if (BVar7 == BAC_BOX_MUX) {
              pHost._4_4_ = Gia_ManHashMux(pNew,(int)pGraph,pGraph._4_4_,pLits[0]);
            }
            else if (BVar7 == BAC_BOX_MAJ) {
              pHost._4_4_ = Gia_ManHashMaj(pNew,(int)pGraph,pGraph._4_4_,pLits[0]);
            }
            else {
              if (BVar7 != BAC_BOX_ADD) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                              ,0xce,
                              "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                             );
              }
              iVar5 = Gia_ManHashAnd(pNew,pGraph._4_4_,pLits[0]);
              iVar6 = Gia_ManHashOr(pNew,pGraph._4_4_,pLits[0]);
              iVar8 = Bac_BoxBoNum(p,iVar4);
              if (iVar8 != 2) {
                __assert_fail("Bac_BoxBoNum(p, iBox) == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                              ,199,
                              "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                             );
              }
              iVar8 = Bac_BoxBo(p,iVar4,0);
              if (iVar8 == i) {
                iVar4 = Abc_LitNot(iVar5);
                iVar4 = Gia_ManHashAnd(pNew,iVar4,iVar6);
                pHost._4_4_ = Gia_ManHashXor(pNew,(int)pGraph,iVar4);
              }
              else {
                iVar4 = Bac_BoxBo(p,iVar4,1);
                if (iVar4 != i) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                                ,0xcc,
                                "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                               );
                }
                iVar4 = Gia_ManHashAnd(pNew,(int)pGraph,iVar6);
                pHost._4_4_ = Gia_ManHashOr(pNew,iVar5,iVar4);
              }
            }
          }
        }
        else {
          pBVar9 = Bac_BoxBoNtk(p,i);
          iVar4 = Bac_ObjIndex(p,i);
          iVar4 = Bac_NtkPo(pBVar9,iVar4);
          pHost._4_4_ = Bac_ManExtract_rec(pNew,pBVar9,iVar4,fBuffers,vMap);
          if (fBuffers != 0) {
            pBVar1 = p->pDesign;
            iVar5 = Bac_NtkId(p);
            iVar6 = Bac_NtkId(pBVar9);
            pHost._4_4_ = Bac_ManAddBarbuf(pNew,pHost._4_4_,pBVar1,iVar5,i,iVar6,iVar4,vMap);
          }
        }
      }
      else {
        pBVar9 = Bac_NtkHostNtk(p);
        iVar4 = Bac_NtkHostObj(p);
        iVar5 = Bac_ObjIndex(p,i);
        iVar4 = Bac_BoxBi(pBVar9,iVar4,iVar5);
        pHost._4_4_ = Bac_ManExtract_rec(pNew,pBVar9,iVar4,fBuffers,vMap);
        if (fBuffers != 0) {
          pBVar1 = p->pDesign;
          iVar5 = Bac_NtkId(p);
          iVar6 = Bac_NtkId(pBVar9);
          pHost._4_4_ = Bac_ManAddBarbuf(pNew,pHost._4_4_,pBVar1,iVar5,i,iVar6,iVar4,vMap);
        }
      }
    }
    else {
      iVar4 = Bac_ObjFanin(p,i);
      pHost._4_4_ = Bac_ManExtract_rec(pNew,p,iVar4,fBuffers,vMap);
    }
    Bac_ObjSetCopy(p,i,pHost._4_4_);
    pNew_local._4_4_ = pHost._4_4_;
  }
  return pNew_local._4_4_;
}

Assistant:

int Bac_ManExtract_rec( Gia_Man_t * pNew, Bac_Ntk_t * p, int i, int fBuffers, Vec_Int_t * vMap )
{
    int iRes = Bac_ObjCopy( p, i );
    if ( iRes >= 0 )
        return iRes;
    if ( Bac_ObjIsCo(p, i) )
        iRes = Bac_ManExtract_rec( pNew, p, Bac_ObjFanin(p, i), fBuffers, vMap );
    else if ( Bac_ObjIsPi(p, i) )
    {
        Bac_Ntk_t * pHost = Bac_NtkHostNtk( p );
        int iObj = Bac_BoxBi( pHost, Bac_NtkHostObj(p), Bac_ObjIndex(p, i) );
        iRes = Bac_ManExtract_rec( pNew, pHost, iObj, fBuffers, vMap );
        if ( fBuffers )
            iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pHost), iObj, vMap );
    }
    else if ( Bac_ObjIsBo(p, i) )
    {
        int iBox = Bac_BoxBoBox(p, i);
        if ( Bac_ObjIsBoxUser(p, iBox) ) // user box
        {
            Bac_Ntk_t * pBox = Bac_BoxBoNtk( p, i );
            int iObj = Bac_NtkPo( pBox, Bac_ObjIndex(p, i) );
            iRes = Bac_ManExtract_rec( pNew, pBox, iObj, fBuffers, vMap );
            if ( fBuffers )
                iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pBox), iObj, vMap );
        }
        else // primitive
        {
            int iFanin, nLits, pLits[16];
            assert( Bac_ObjIsBoxPrim(p, iBox) );
            Bac_BoxForEachFanin( p, iBox, iFanin, nLits )
                pLits[nLits] = Bac_ManExtract_rec( pNew, p, iFanin, fBuffers, vMap );
            assert( nLits <= 16 );
            if ( p->pDesign->ppGraphs ) // mapped gate
            {
                extern int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves );
                Dec_Graph_t * pGraph = (Dec_Graph_t *)p->pDesign->ppGraphs[Bac_BoxNtkId(p, iBox)];
                Vec_Int_t Leaves = { nLits, nLits, pLits };
                assert( pGraph != NULL );
                return Gia_ManFactorGraph( pNew, pGraph, &Leaves );
            }
            else
            {
                Bac_ObjType_t Type = Bac_ObjType(p, iBox);
                if ( nLits == 0 )
                {
                    if ( Type == BAC_BOX_CF )
                        iRes = 0;
                    else if ( Type == BAC_BOX_CT )
                        iRes = 1;
                    else assert( 0 );
                }
                else if ( nLits == 1 )
                {
                    if ( Type == BAC_BOX_BUF )
                        iRes = pLits[0];
                    else if ( Type == BAC_BOX_INV )
                        iRes = Abc_LitNot( pLits[0] );
                    else assert( 0 );
                }
                else if ( nLits == 2 )
                {
                    if ( Type == BAC_BOX_AND )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NAND )
                        iRes = Abc_LitNot( Gia_ManHashAnd( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_OR )
                        iRes = Gia_ManHashOr( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NOR )
                        iRes = Abc_LitNot( Gia_ManHashOr( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_XOR )
                        iRes = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_XNOR )
                        iRes = Abc_LitNot( Gia_ManHashXor( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_SHARP )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], Abc_LitNot(pLits[1]) );
                    else if ( Type == BAC_BOX_SHARPL )
                        iRes = Gia_ManHashAnd( pNew, Abc_LitNot(pLits[0]), pLits[1] );
                    else assert( 0 );
                }
                else if ( nLits == 3 )
                {
                    if ( Type == BAC_BOX_MUX )
                        iRes = Gia_ManHashMux( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_MAJ )
                        iRes = Gia_ManHashMaj( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_ADD )
                    {
                        int iRes0 = Gia_ManHashAnd( pNew, pLits[1], pLits[2] );
                        int iRes1 = Gia_ManHashOr( pNew, pLits[1], pLits[2] );
                        assert( Bac_BoxBoNum(p, iBox) == 2 );
                        if ( Bac_BoxBo(p, iBox, 0) == i ) // sum
                            iRes = Gia_ManHashXor( pNew, pLits[0], Gia_ManHashAnd(pNew, Abc_LitNot(iRes0), iRes1) );
                        else if ( Bac_BoxBo(p, iBox, 1) == i ) // cout
                            iRes = Gia_ManHashOr( pNew, iRes0, Gia_ManHashAnd(pNew, pLits[0], iRes1) );
                        else assert( 0 );
                    }
                    else assert( 0 );
                }
                else assert( 0 );
            }
        }
    }
    else assert( 0 );
    Bac_ObjSetCopy( p, i, iRes );
    return iRes;
}